

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_context.c
# Opt level: O1

int coda_pcre2_set_newline_8(pcre2_compile_context_8 *ccontext,uint32_t newline)

{
  int iVar1;
  
  iVar1 = -0x1d;
  if (newline - 1 < 6) {
    ccontext->newline_convention = (uint16_t)newline;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_set_newline(pcre2_compile_context *ccontext, uint32_t newline)
{
switch(newline)
  {
  case PCRE2_NEWLINE_CR:
  case PCRE2_NEWLINE_LF:
  case PCRE2_NEWLINE_CRLF:
  case PCRE2_NEWLINE_ANY:
  case PCRE2_NEWLINE_ANYCRLF:
  case PCRE2_NEWLINE_NUL:
  ccontext->newline_convention = newline;
  return 0;

  default:
  return PCRE2_ERROR_BADDATA;
  }
}